

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O1

PipeThread * __thiscall
kj::anon_unknown_0::AsyncIoProviderImpl::newPipeThread
          (PipeThread *__return_storage_ptr__,AsyncIoProviderImpl *this,
          Function<void_(kj::AsyncIoProvider_&,_kj::AsyncIoStream_&,_kj::WaitScope_&)> *startFunc)

{
  Disposer *pDVar1;
  Iface *pIVar2;
  Iface *pIVar3;
  int iVar4;
  Thread *this_00;
  Fault f;
  int threadFd;
  Own<kj::AsyncIoStream,_std::nullptr_t> pipe;
  int fds [2];
  UnwindDetector _kjUnwindDetector2019;
  Function<void_()> local_88;
  int local_74;
  Disposer *local_70;
  AsyncIoStream *local_68;
  undefined8 local_60;
  NullableValue<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_unix_c__:2019:5)>
  local_58;
  UnwindDetector local_34;
  
  local_60 = 0;
  do {
    iVar4 = socketpair(1,0x80801,0,(int *)&local_60);
    if (-1 < iVar4) {
      iVar4 = 0;
      break;
    }
    iVar4 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar4 == -1);
  if (iVar4 == 0) {
    local_74 = local_60._4_4_;
    UnwindDetector::UnwindDetector(&local_34);
    local_58.isSet = true;
    local_58.field_1.value._kjUnwindDetector2019 = &local_34;
    local_58.field_1.value.threadFd = &local_74;
    (*this->lowLevel->_vptr_LowLevelAsyncIoProvider[2])
              (&local_70,this->lowLevel,local_60 & 0xffffffff,7);
    iVar4 = local_74;
    pDVar1 = (startFunc->impl).disposer;
    pIVar2 = (startFunc->impl).ptr;
    (startFunc->impl).ptr = (Iface *)0x0;
    this_00 = (Thread *)operator_new(0x18);
    local_88.impl.ptr = (Iface *)operator_new(0x20);
    (local_88.impl.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___0070db70;
    *(int *)&local_88.impl.ptr[1]._vptr_Iface = iVar4;
    local_88.impl.ptr[2]._vptr_Iface = (_func_int **)pDVar1;
    local_88.impl.ptr[3]._vptr_Iface = (_func_int **)pIVar2;
    local_88.impl.disposer =
         (Disposer *)
         &kj::_::
          HeapDisposer<kj::Function<void()>::Impl<kj::(anonymous_namespace)::AsyncIoProviderImpl::newPipeThread(kj::Function<void(kj::AsyncIoProvider&,kj::AsyncIoStream&,kj::WaitScope&)>)::{lambda()#3}>>
          ::instance;
    Thread::Thread(this_00,&local_88);
    pIVar3 = local_88.impl.ptr;
    if (local_88.impl.ptr != (Iface *)0x0) {
      local_88.impl.ptr = (Iface *)0x0;
      (**(local_88.impl.disposer)->_vptr_Disposer)
                (local_88.impl.disposer,pIVar3->_vptr_Iface[-2] + (long)&pIVar3->_vptr_Iface);
    }
    (__return_storage_ptr__->thread).disposer =
         (Disposer *)&kj::_::HeapDisposer<kj::Thread>::instance;
    (__return_storage_ptr__->thread).ptr = this_00;
    (__return_storage_ptr__->pipe).disposer = local_70;
    (__return_storage_ptr__->pipe).ptr = local_68;
    kj::_::
    Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:2019:5)>
    ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_unix_c__:2019:5)>
                 *)&local_58);
    return __return_storage_ptr__;
  }
  local_88.impl.disposer = (Disposer *)0x0;
  local_58.isSet = false;
  local_58._1_7_ = 0;
  local_58.field_1.value._kjUnwindDetector2019 = (UnwindDetector *)0x0;
  kj::_::Debug::Fault::init
            ((Fault *)&local_88,
             (EVP_PKEY_CTX *)
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
            );
  kj::_::Debug::Fault::fatal((Fault *)&local_88);
}

Assistant:

PipeThread newPipeThread(
      Function<void(AsyncIoProvider&, AsyncIoStream&, WaitScope&)> startFunc) override {
    int fds[2]{};
    int type = SOCK_STREAM;
#if __linux__ && !__BIONIC__
    type |= SOCK_NONBLOCK | SOCK_CLOEXEC;
#endif
    KJ_SYSCALL(socketpair(AF_UNIX, type, 0, fds));

    int threadFd = fds[1];
    KJ_ON_SCOPE_FAILURE(close(threadFd));

    auto pipe = lowLevel.wrapSocketFd(fds[0], NEW_FD_FLAGS);

    auto thread = heap<Thread>([threadFd,startFunc=kj::mv(startFunc)]() mutable {
      UnixEventPort eventPort;
      EventLoop eventLoop(eventPort);
      WaitScope waitScope(eventLoop);
      LowLevelAsyncIoProviderImpl lowLevel(eventPort);
      auto stream = lowLevel.wrapSocketFd(threadFd, NEW_FD_FLAGS);
      AsyncIoProviderImpl ioProvider(lowLevel);
      startFunc(ioProvider, *stream, waitScope);
    });

    return { kj::mv(thread), kj::mv(pipe) };
  }